

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

filename_t *
spdlog::sinks::rotating_file_sink<std::mutex>::calc_filename(filename_t *filename,size_t index)

{
  size_type *psVar1;
  long in_RDX;
  size_t sVar2;
  filename_t *in_RDI;
  basic_string_view<char> bVar3;
  undefined1 in_stack_00000070 [16];
  string_view in_stack_00000080;
  filename_t ext;
  filename_t basename;
  int ignore;
  string_view sv;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  _Alloc_hider in_stack_fffffffffffffe50;
  undefined1 local_140 [24];
  filename_t *in_stack_fffffffffffffed8;
  undefined1 local_120 [32];
  undefined8 local_100 [3];
  undefined1 local_e8 [16];
  undefined8 local_d8 [4];
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  int local_5c;
  char *local_58;
  undefined8 local_50;
  undefined1 *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  if (in_RDX == 0) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50._M_p,in_stack_fffffffffffffe48);
  }
  else {
    std::__cxx11::string::string(in_stack_fffffffffffffe20);
    std::__cxx11::string::string(in_stack_fffffffffffffe20);
    details::file_helper::split_by_extension(in_stack_fffffffffffffed8);
    std::tie<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x6f3d39);
    calc_filename::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffe20);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffe50;
    local_40 = &stack0xfffffffffffffe4f;
    local_38 = this;
    bVar3 = ::fmt::v11::operator()((FMT_COMPILE_STRING *)0x6f3d79);
    sVar2 = bVar3.size_;
    psVar1 = &this->_M_string_length;
    this->_M_dataplus = (_Alloc_hider)bVar3.data_;
    *psVar1 = sVar2;
    local_58 = "{}.{}{}";
    local_50 = 7;
    local_5c = 0;
    ::fmt::v11::detail::ignore_unused<int>(&local_5c);
    local_80 = local_120;
    local_88 = local_100;
    local_90 = local_140;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)bVar3.data_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.size_);
    local_28 = local_d8;
    local_30 = *local_88;
    local_10 = local_30;
    local_8 = local_28;
    local_d8[0] = local_30;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)bVar3.data_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar3.size_);
    local_18 = &local_b8;
    local_20 = local_e8;
    local_b8 = 0xd4d;
    local_b0 = local_20;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_00000080,(format_args)in_stack_00000070);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string(this);
  }
  return in_RDI;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::calc_filename(const filename_t &filename,
                                                                  std::size_t index) {
    if (index == 0u) {
        return filename;
    }

    filename_t basename, ext;
    std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
    return fmt_lib::format(SPDLOG_FMT_STRING(SPDLOG_FILENAME_T("{}.{}{}")), basename, index, ext);
}